

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_PackedSerializationToStream_Test::
TestBody(ExtensionSetTest_PackedSerializationToStream_Test *this)

{
  bool bVar1;
  size_t sVar2;
  void *data_00;
  char *pcVar3;
  char *in_R9;
  string local_2b8;
  AssertHelper local_298;
  Message local_290;
  string_view local_288;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__1;
  string local_258;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_;
  CodedOutputStream output_stream;
  ArrayOutputStream array_stream;
  string data;
  size_t size;
  undefined1 local_168 [8];
  TestPackedTypes destination;
  TestPackedExtensions source;
  ExtensionSetTest_PackedSerializationToStream_Test *this_local;
  
  proto2_unittest::TestPackedExtensions::TestPackedExtensions
            ((TestPackedExtensions *)&destination.field_0._impl_._packed_enum_cached_byte_size_);
  proto2_unittest::TestPackedTypes::TestPackedTypes((TestPackedTypes *)local_168);
  TestUtil::SetPackedExtensions<proto2_unittest::TestPackedExtensions>
            ((TestPackedExtensions *)&destination.field_0._impl_._packed_enum_cached_byte_size_);
  sVar2 = proto2_unittest::TestPackedExtensions::ByteSizeLong
                    ((TestPackedExtensions *)
                     &destination.field_0._impl_._packed_enum_cached_byte_size_);
  std::__cxx11::string::string((string *)&array_stream.position_);
  std::__cxx11::string::resize((ulong)&array_stream.position_);
  data_00 = (void *)std::__cxx11::string::operator[]((ulong)&array_stream.position_);
  data.field_2._8_4_ = (undefined4)sVar2;
  protobuf::io::ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)&output_stream.start_count_,data_00,data.field_2._8_4_,1);
  protobuf::io::CodedOutputStream::CodedOutputStream<google::protobuf::io::ArrayOutputStream,void>
            ((CodedOutputStream *)&gtest_ar_.message_,
             (ArrayOutputStream *)&output_stream.start_count_);
  protobuf::MessageLite::SerializeWithCachedSizes
            ((MessageLite *)&destination.field_0._impl_._packed_enum_cached_byte_size_,
             (CodedOutputStream *)&gtest_ar_.message_);
  bVar1 = protobuf::io::CodedOutputStream::HadError((CodedOutputStream *)&gtest_ar_.message_);
  local_221 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_220,&local_221,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_258,(internal *)local_220,(AssertionResult *)"output_stream.HadError()","true"
               ,"false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x262,pcVar3);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    testing::Message::~Message(&local_230);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  protobuf::io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&gtest_ar_.message_);
  protobuf::io::ArrayOutputStream::~ArrayOutputStream
            ((ArrayOutputStream *)&output_stream.start_count_);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_288 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&array_stream.position_);
    local_271 = protobuf::MessageLite::ParseFromString((MessageLite *)local_168,local_288);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_270,&local_271,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2b8,(internal *)local_270,
                 (AssertionResult *)"destination.ParseFromString(data)","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x264,pcVar3);
      testing::internal::AssertHelper::operator=(&local_298,&local_290);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
      testing::Message::~Message(&local_290);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    TestUtil::ExpectPackedFieldsSet<proto2_unittest::TestPackedTypes>((TestPackedTypes *)local_168);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)&array_stream.position_);
  proto2_unittest::TestPackedTypes::~TestPackedTypes((TestPackedTypes *)local_168);
  proto2_unittest::TestPackedExtensions::~TestPackedExtensions
            ((TestPackedExtensions *)&destination.field_0._impl_._packed_enum_cached_byte_size_);
  return;
}

Assistant:

TEST(ExtensionSetTest, PackedSerializationToStream) {
  // Serialize as TestPackedExtensions and parse as TestPackedTypes to insure
  // wire compatibility of extensions.
  //
  // This checks serialization to an output stream by creating an array output
  // stream that can only buffer 1 byte at a time - this prevents the message
  // from ever jumping to the fast path, ensuring that serialization happens via
  // the CodedOutputStream.
  unittest::TestPackedExtensions source;
  unittest::TestPackedTypes destination;
  TestUtil::SetPackedExtensions(&source);
  size_t size = source.ByteSizeLong();
  std::string data;
  data.resize(size);
  {
    io::ArrayOutputStream array_stream(&data[0], size, 1);
    io::CodedOutputStream output_stream(&array_stream);
    source.SerializeWithCachedSizes(&output_stream);
    ASSERT_FALSE(output_stream.HadError());
  }
  EXPECT_TRUE(destination.ParseFromString(data));
  TestUtil::ExpectPackedFieldsSet(destination);
}